

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynTypedef * ParseTypedef(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  SynBase *this;
  undefined4 extraout_var;
  SynIdentifier *this_00;
  undefined4 extraout_var_01;
  SynTypedef *this_01;
  Lexeme *pLVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_typedef) {
    ctx->currentLexeme = begin + 1;
    this = ParseType(ctx,(bool *)0x0,false);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_15703::Report
                (ctx,ctx->currentLexeme,"ERROR: typename expected after typedef");
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0011765e;
      SynBase::SynBase(this,0,begin,ctx->currentLexeme + -1);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
    }
    bVar3 = anon_unknown.dwarf_15703::CheckAt
                      (ctx,lex_string,
                       "ERROR: alias name expected after typename in typedef expression");
    if (bVar3) {
      pLVar5 = ctx->currentLexeme;
      pcVar2 = pLVar5->pos;
      uVar1 = pLVar5->length;
      if (pLVar5->type != lex_none) {
        ctx->currentLexeme = pLVar5 + 1;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this_00 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0011765e;
      pLVar5 = ctx->currentLexeme + -1;
      SynBase::SynBase((SynBase *)this_00,4,pLVar5,pLVar5);
      (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
      (this_00->name).begin = pcVar2;
      (this_00->name).end = pcVar2 + uVar1;
    }
    else {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this_00 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar4);
      (this_00->super_SynBase).typeID = 4;
      (this_00->super_SynBase).begin = (Lexeme *)0x0;
      (this_00->super_SynBase).end = (Lexeme *)0x0;
      (this_00->super_SynBase).pos.begin = (char *)0x0;
      (this_00->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(this_00->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(this_00->super_SynBase).next + 2) = 0;
      (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
      (this_00->name).begin = (char *)0x0;
      (this_00->name).end = (char *)0x0;
    }
    anon_unknown.dwarf_15703::CheckConsume(ctx,lex_semicolon,"ERROR: \';\' not found after typedef")
    ;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this_01 = (SynTypedef *)CONCAT44(extraout_var_02,iVar4);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_0011765e:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)this_01,0x16,begin,ctx->currentLexeme + -1);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00247aa8;
    this_01->type = this;
    this_01->alias = this_00;
  }
  else {
    this_01 = (SynTypedef *)0x0;
  }
  return this_01;
}

Assistant:

SynTypedef* ParseTypedef(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_typedef))
	{
		SynBase *type = ParseType(ctx);

		if(!type)
		{
			Report(ctx, ctx.Current(), "ERROR: typename expected after typedef");

			type = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		SynIdentifier *aliasIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: alias name expected after typename in typedef expression"))
		{
			InplaceStr alias = ctx.Consume();
			aliasIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias);
		}
		else
		{
			aliasIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after typedef");

		return new (ctx.get<SynTypedef>()) SynTypedef(start, ctx.Previous(), type, aliasIdentifier);
	}

	return NULL;
}